

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PolyKernel::SerializeWithCachedSizes
          (PolyKernel *this,CodedOutputStream *output)

{
  double dVar1;
  
  if (this->degree_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(1,this->degree_,output);
  }
  dVar1 = this->c_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    google::protobuf::internal::WireFormatLite::WriteDouble(2,dVar1,output);
  }
  dVar1 = this->gamma_;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(3,dVar1,output);
  return;
}

Assistant:

void PolyKernel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PolyKernel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 degree = 1;
  if (this->degree() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->degree(), output);
  }

  // double c = 2;
  if (this->c() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->c(), output);
  }

  // double gamma = 3;
  if (this->gamma() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(3, this->gamma(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PolyKernel)
}